

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_state.cpp
# Opt level: O3

int (anonymous_namespace)::store_int<unsigned_long,char>
              (unsigned_long *out,char *val,unsigned_long min,unsigned_long max)

{
  int *piVar1;
  ulong uVar2;
  char *end;
  char *pcStack_18;
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  uVar2 = strtol((char *)out,&pcStack_18,10);
  if (uVar2 == 0) {
    if (*piVar1 != 0) {
      return 3;
    }
  }
  else if (0x7fffffff < uVar2) {
    return 2;
  }
  global_state_singleton._960_8_ = uVar2;
  return 0;
}

Assistant:

int store_int(INT_T *out, const CHAR_T *val, INT_T min, INT_T max)
{
    errno = 0;
    long val_as_long = to_long(val);
    if (val_as_long == 0 && errno != 0)
        return __CILKRTS_SET_PARAM_INVALID;
    if (val_as_long < min || val_as_long == LONG_MIN)
        return __CILKRTS_SET_PARAM_XRANGE;
    else if (val_as_long > max || val_as_long == LONG_MAX)
        return __CILKRTS_SET_PARAM_XRANGE;

    *out = val_as_long;
    return __CILKRTS_SET_PARAM_SUCCESS;
}